

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

int fiobj_data_save(FIOBJ o,char *filename)

{
  char *filename_local;
  FIOBJ o_local;
  
  if (*(int *)(o + 0x30) == -2) {
    o_local._4_4_ = fiobj_data_save_slice(o,filename);
  }
  else if (*(int *)(o + 0x30) == -1) {
    o_local._4_4_ = fiobj_data_save_str(o,filename);
  }
  else {
    o_local._4_4_ = fiobj_data_save_file(o,filename);
  }
  return o_local._4_4_;
}

Assistant:

int fiobj_data_save(FIOBJ o, const char *filename) {
  switch (obj2io(o)->fd) {
  case -1:
    return fiobj_data_save_str(o, filename);
    break;
  case -2:
    return fiobj_data_save_slice(o, filename);
    break;
  default:
    return fiobj_data_save_file(o, filename);
  }
}